

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void insertCell(MemPage *pPage,int i,u8 *pCell,int sz,u8 *pTemp,Pgno iChild,int *pRC)

{
  ushort *puVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  u8 *puVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  uint *__dest;
  int rc;
  int local_54;
  ulong local_50;
  u8 *local_48;
  uint local_40;
  uint local_3c;
  int *local_38;
  
  if ((pPage->nOverflow != '\0') || (local_3c = sz + 2, pPage->nFree < (int)local_3c)) {
    if (pTemp != (u8 *)0x0) {
      memcpy(pTemp,pCell,(long)sz);
      pCell = pTemp;
    }
    if (iChild != 0) {
      *(Pgno *)pCell =
           iChild >> 0x18 | (iChild & 0xff0000) >> 8 | (iChild & 0xff00) << 8 | iChild << 0x18;
    }
    bVar2 = pPage->nOverflow;
    pPage->nOverflow = bVar2 + 1;
    pPage->apOvfl[bVar2] = pCell;
    pPage->aiOvfl[bVar2] = (u16)i;
    return;
  }
  iVar4 = sqlite3PagerWrite(pPage->pDbPage);
  if (iVar4 != 0) {
    *pRC = iVar4;
    return;
  }
  local_48 = pPage->aData;
  uVar11 = (ulong)pPage->hdrOffset;
  local_54 = 0;
  uVar10 = (uint)pPage->cellOffset + (uint)pPage->nCell * 2;
  uVar3 = *(ushort *)(local_48 + uVar11 + 5) << 8 | *(ushort *)(local_48 + uVar11 + 5) >> 8;
  uVar8 = (uint)uVar3;
  local_38 = pRC;
  if ((uVar3 < uVar10) && ((uVar3 != 0 || (uVar8 = 0x10000, pPage->pBt->usableSize != 0x10000)))) {
    iVar6 = 0xb;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xfd79,
                "fc82b73eaac8b36950e527f12c4b5dc1e147e6f4ad2217ae43ad82882a88bfa6");
    iVar4 = 0;
  }
  else {
    if (((local_48[uVar11 + 2] != '\0') || (iVar4 = 0, local_48[uVar11 + 1] != '\0')) &&
       (iVar4 = 0, uVar10 + 2 <= uVar8)) {
      local_50 = uVar11;
      local_40 = uVar8;
      puVar7 = pageFindSlot(pPage,sz,&local_54);
      iVar6 = 0;
      iVar4 = (int)puVar7 - (int)local_48;
      if (puVar7 == (u8 *)0x0) {
        iVar6 = local_54;
        iVar4 = 0;
      }
      uVar11 = local_50;
      uVar8 = local_40;
      if (puVar7 != (u8 *)0x0 || local_54 != 0) goto LAB_00178d4f;
    }
    if ((int)uVar8 < (int)(uVar10 + sz + 2)) {
      iVar5 = (pPage->nFree - sz) + -2;
      iVar6 = 4;
      if (iVar5 < 4) {
        iVar6 = iVar5;
      }
      local_50 = CONCAT44(local_50._4_4_,iVar4);
      iVar6 = defragmentPage(pPage,iVar6);
      iVar4 = (int)local_50;
      local_54 = iVar6;
      if (iVar6 != 0) goto LAB_00178d4f;
      uVar8 = (((uint)local_48[uVar11 + 5] * 0x100 + (uint)local_48[uVar11 + 6]) - 1 & 0xffff) + 1;
    }
    iVar4 = uVar8 - sz;
    *(ushort *)(local_48 + uVar11 + 5) = (ushort)iVar4 << 8 | (ushort)iVar4 >> 8;
    iVar6 = 0;
  }
LAB_00178d4f:
  if (iVar6 == 0) {
    pPage->nFree = pPage->nFree - (local_3c & 0xffff);
    local_50 = CONCAT44(local_50._4_4_,iVar4);
    __dest = (uint *)(local_48 + iVar4);
    if (iChild == 0) {
      memcpy(__dest,pCell,(long)sz);
    }
    else {
      memcpy(__dest + 1,pCell + 4,(long)(sz + -4));
      *__dest = iChild >> 0x18 | (iChild & 0xff0000) >> 8 | (iChild & 0xff00) << 8 | iChild << 0x18;
    }
    lVar9 = (long)i;
    puVar1 = (ushort *)(pPage->aCellIdx + lVar9 * 2);
    memmove(puVar1 + 1,pPage->aCellIdx + lVar9 * 2,((ulong)pPage->nCell - lVar9) * 2);
    *puVar1 = (ushort)local_50 << 8 | (ushort)local_50 >> 8;
    pPage->nCell = pPage->nCell + 1;
    puVar7 = local_48 + (ulong)pPage->hdrOffset + 4;
    *puVar7 = *puVar7 + '\x01';
    if (*puVar7 == '\0') {
      local_48[(ulong)pPage->hdrOffset + 3] = local_48[(ulong)pPage->hdrOffset + 3] + '\x01';
    }
    if (pPage->pBt->autoVacuum != '\0') {
      ptrmapPutOvflPtr(pPage,pPage,pCell,local_38);
      return;
    }
  }
  else {
    *local_38 = iVar6;
  }
  return;
}

Assistant:

static void insertCell(
  MemPage *pPage,   /* Page into which we are copying */
  int i,            /* New cell becomes the i-th cell of the page */
  u8 *pCell,        /* Content of the new cell */
  int sz,           /* Bytes of content in pCell */
  u8 *pTemp,        /* Temp storage space for pCell, if needed */
  Pgno iChild,      /* If non-zero, replace first 4 bytes with this value */
  int *pRC          /* Read and write return code from here */
){
  int idx = 0;      /* Where to write new cell content in data[] */
  int j;            /* Loop counter */
  u8 *data;         /* The content of the whole page */
  u8 *pIns;         /* The point in pPage->aCellIdx[] where no cell inserted */

  assert( *pRC==SQLITE_OK );
  assert( i>=0 && i<=pPage->nCell+pPage->nOverflow );
  assert( MX_CELL(pPage->pBt)<=10921 );
  assert( pPage->nCell<=MX_CELL(pPage->pBt) || CORRUPT_DB );
  assert( pPage->nOverflow<=ArraySize(pPage->apOvfl) );
  assert( ArraySize(pPage->apOvfl)==ArraySize(pPage->aiOvfl) );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  /* The cell should normally be sized correctly.  However, when moving a
  ** malformed cell from a leaf page to an interior page, if the cell size
  ** wanted to be less than 4 but got rounded up to 4 on the leaf, then size
  ** might be less than 8 (leaf-size + pointer) on the interior node.  Hence
  ** the term after the || in the following assert(). */
  assert( sz==pPage->xCellSize(pPage, pCell) || (sz==8 && iChild>0) );
  assert( pPage->nFree>=0 );
  if( pPage->nOverflow || sz+2>pPage->nFree ){
    if( pTemp ){
      memcpy(pTemp, pCell, sz);
      pCell = pTemp;
    }
    if( iChild ){
      put4byte(pCell, iChild);
    }
    j = pPage->nOverflow++;
    /* Comparison against ArraySize-1 since we hold back one extra slot
    ** as a contingency.  In other words, never need more than 3 overflow
    ** slots but 4 are allocated, just to be safe. */
    assert( j < ArraySize(pPage->apOvfl)-1 );
    pPage->apOvfl[j] = pCell;
    pPage->aiOvfl[j] = (u16)i;

    /* When multiple overflows occur, they are always sequential and in
    ** sorted order.  This invariants arise because multiple overflows can
    ** only occur when inserting divider cells into the parent page during
    ** balancing, and the dividers are adjacent and sorted.
    */
    assert( j==0 || pPage->aiOvfl[j-1]<(u16)i ); /* Overflows in sorted order */
    assert( j==0 || i==pPage->aiOvfl[j-1]+1 );   /* Overflows are sequential */
  }else{
    int rc = sqlite3PagerWrite(pPage->pDbPage);
    if( rc!=SQLITE_OK ){
      *pRC = rc;
      return;
    }
    assert( sqlite3PagerIswriteable(pPage->pDbPage) );
    data = pPage->aData;
    assert( &data[pPage->cellOffset]==pPage->aCellIdx );
    rc = allocateSpace(pPage, sz, &idx);
    if( rc ){ *pRC = rc; return; }
    /* The allocateSpace() routine guarantees the following properties
    ** if it returns successfully */
    assert( idx >= 0 );
    assert( idx >= pPage->cellOffset+2*pPage->nCell+2 || CORRUPT_DB );
    assert( idx+sz <= (int)pPage->pBt->usableSize );
    pPage->nFree -= (u16)(2 + sz);
    if( iChild ){
      /* In a corrupt database where an entry in the cell index section of
      ** a btree page has a value of 3 or less, the pCell value might point
      ** as many as 4 bytes in front of the start of the aData buffer for
      ** the source page.  Make sure this does not cause problems by not
      ** reading the first 4 bytes */
      memcpy(&data[idx+4], pCell+4, sz-4);
      put4byte(&data[idx], iChild);
    }else{
      memcpy(&data[idx], pCell, sz);
    }
    pIns = pPage->aCellIdx + i*2;
    memmove(pIns+2, pIns, 2*(pPage->nCell - i));
    put2byte(pIns, idx);
    pPage->nCell++;
    /* increment the cell count */
    if( (++data[pPage->hdrOffset+4])==0 ) data[pPage->hdrOffset+3]++;
    assert( get2byte(&data[pPage->hdrOffset+3])==pPage->nCell || CORRUPT_DB );
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pPage->pBt->autoVacuum ){
      /* The cell may contain a pointer to an overflow page. If so, write
      ** the entry for the overflow page into the pointer map.
      */
      ptrmapPutOvflPtr(pPage, pPage, pCell, pRC);
    }
#endif
  }
}